

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_set_stream_user_data
              (nghttp2_session *session,int32_t stream_id,void *stream_user_data)

{
  int iVar1;
  int iVar2;
  nghttp2_stream *pnVar3;
  void **ppvVar4;
  nghttp2_outbound_item *pnVar5;
  
  pnVar3 = nghttp2_session_get_stream(session,stream_id);
  if (pnVar3 == (nghttp2_stream *)0x0) {
    iVar2 = -0x1f5;
    if ((((stream_id & 1U) != 0) && (session->server == '\0')) &&
       (pnVar5 = (session->ob_syn).head, pnVar5 != (nghttp2_outbound_item *)0x0)) {
      if ((pnVar5->frame).hd.type != '\x01') {
        __assert_fail("frame->hd.type == NGHTTP2_HEADERS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                      ,0x1eb8,
                      "int nghttp2_session_set_stream_user_data(nghttp2_session *, int32_t, void *)"
                     );
      }
      if (((pnVar5->frame).hd.stream_id <= stream_id) && ((uint)stream_id < session->next_stream_id)
         ) {
        for (; pnVar5 != (nghttp2_outbound_item *)0x0; pnVar5 = pnVar5->qnext) {
          iVar1 = (pnVar5->frame).hd.stream_id;
          if (stream_id <= iVar1) {
            if (stream_id < iVar1) {
              return -0x1f5;
            }
            ppvVar4 = &(pnVar5->aux_data).headers.stream_user_data;
            goto LAB_00468bbf;
          }
        }
      }
    }
  }
  else {
    ppvVar4 = &pnVar3->stream_user_data;
LAB_00468bbf:
    *ppvVar4 = stream_user_data;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int nghttp2_session_set_stream_user_data(nghttp2_session *session,
                                         int32_t stream_id,
                                         void *stream_user_data) {
  nghttp2_stream *stream;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;

  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream) {
    stream->stream_user_data = stream_user_data;
    return 0;
  }

  if (session->server || !nghttp2_session_is_my_stream_id(session, stream_id) ||
      !nghttp2_outbound_queue_top(&session->ob_syn)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  frame = &nghttp2_outbound_queue_top(&session->ob_syn)->frame;
  assert(frame->hd.type == NGHTTP2_HEADERS);

  if (frame->hd.stream_id > stream_id ||
      (uint32_t)stream_id >= session->next_stream_id) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  for (item = session->ob_syn.head; item; item = item->qnext) {
    if (item->frame.hd.stream_id < stream_id) {
      continue;
    }

    if (item->frame.hd.stream_id > stream_id) {
      break;
    }

    item->aux_data.headers.stream_user_data = stream_user_data;
    return 0;
  }

  return NGHTTP2_ERR_INVALID_ARGUMENT;
}